

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

void * rw::rasterOpen(void *object,int32 offset,int32 size)

{
  undefined4 local_1c;
  int i;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  rasterModuleOffset = offset;
  *(undefined4 *)(engine + offset) = 0xffffffff;
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    *(undefined8 *)(engine + rasterModuleOffset + 8 + (long)local_1c * 8) = 0;
  }
  return object;
}

Assistant:

static void*
rasterOpen(void *object, int32 offset, int32 size)
{
	int i;
	rasterModuleOffset = offset;
	RASTERGLOBAL(sp) = -1;
	for(i = 0; i < (int)nelem(RASTERGLOBAL(stack)); i++)
		RASTERGLOBAL(stack)[i] = nil;
	return object;
}